

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

int OSSL_HTTP_set1_request
              (OSSL_HTTP_REQ_CTX *rctx,char *path,stack_st_CONF_VALUE *headers,char *content_type,
              BIO *req,char *expected_content_type,int expect_asn1,size_t max_resp_len,int timeout,
              int keep_alive)

{
  uint uVar1;
  int iVar2;
  stack_st_CONF_VALUE *in_RDI;
  long in_R8;
  bool bVar3;
  undefined8 in_stack_00000010;
  int use_http_proxy;
  BIO *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint keep_alive_00;
  undefined8 in_stack_ffffffffffffffa8;
  OSSL_HTTP_REQ_CTX *rctx_00;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint local_4;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (in_RDI == (stack_st_CONF_VALUE *)0x0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffffb0,iVar2,
                  (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    ERR_set_error(0x3d,0xc0102,(char *)0x0);
    local_4 = 0;
  }
  else {
    bVar3 = false;
    if (*(long *)(in_RDI + 0x40) != 0) {
      bVar3 = *(int *)(in_RDI + 0x38) == 0;
    }
    if ((bVar3) && (*(long *)(in_RDI + 0x48) == 0)) {
      ERR_new();
      ERR_set_debug(in_stack_ffffffffffffffb0,iVar2,
                    (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      ERR_set_error(0x3d,0x80106,(char *)0x0);
      local_4 = 0;
    }
    else {
      *(undefined8 *)(in_RDI + 0x98) = in_stack_00000010;
      uVar1 = (uint)(in_R8 != 0);
      if (bVar3) {
        rctx_00 = *(OSSL_HTTP_REQ_CTX **)(in_RDI + 0x48);
      }
      else {
        rctx_00 = (OSSL_HTTP_REQ_CTX *)0x0;
      }
      iVar2 = OSSL_HTTP_REQ_CTX_set_request_line
                        ((OSSL_HTTP_REQ_CTX *)(ulong)CONCAT14(in_R8 != 0,in_stack_ffffffffffffffb8),
                         (int)((ulong)in_RDI >> 0x20),(char *)rctx_00,
                         (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (char *)in_stack_ffffffffffffff98);
      local_4 = in_stack_ffffffffffffffa4 & 0xffffff;
      if (iVar2 != 0) {
        iVar2 = add1_headers((OSSL_HTTP_REQ_CTX *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),in_RDI,
                             (char *)rctx_00);
        keep_alive_00 = local_4 & 0xffffff;
        local_4 = keep_alive_00;
        if (iVar2 != 0) {
          iVar2 = OSSL_HTTP_REQ_CTX_set_expected
                            ((OSSL_HTTP_REQ_CTX *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),
                             (char *)in_RDI,(int)((ulong)rctx_00 >> 0x20),(int)rctx_00,keep_alive_00
                            );
          local_4 = 0;
          if (iVar2 != 0) {
            iVar2 = set1_content(rctx_00,(char *)(CONCAT44(keep_alive_00,in_stack_ffffffffffffffa0)
                                                 & 0xffffffffffffff),in_stack_ffffffffffffff98);
            local_4 = (uint)(iVar2 != 0) << 0x18;
          }
        }
      }
      local_4 = local_4 >> 0x18;
    }
  }
  return local_4;
}

Assistant:

int OSSL_HTTP_set1_request(OSSL_HTTP_REQ_CTX *rctx, const char *path,
                           const STACK_OF(CONF_VALUE) *headers,
                           const char *content_type, BIO *req,
                           const char *expected_content_type, int expect_asn1,
                           size_t max_resp_len, int timeout, int keep_alive)
{
    int use_http_proxy;

    if (rctx == NULL) {
        ERR_raise(ERR_LIB_HTTP, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }
    use_http_proxy = rctx->proxy != NULL && !rctx->use_ssl;
    if (use_http_proxy && rctx->server == NULL) {
        ERR_raise(ERR_LIB_HTTP, ERR_R_PASSED_INVALID_ARGUMENT);
        return 0;
    }
    rctx->max_resp_len = max_resp_len; /* allows for 0: indefinite */

    return OSSL_HTTP_REQ_CTX_set_request_line(rctx, req != NULL,
                                              use_http_proxy ? rctx->server
                                              : NULL, rctx->port, path)
        && add1_headers(rctx, headers, rctx->server)
        && OSSL_HTTP_REQ_CTX_set_expected(rctx, expected_content_type,
                                          expect_asn1, timeout, keep_alive)
        && set1_content(rctx, content_type, req);
}